

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

int ON_SolveQuadraticEquation(double a,double b,double c,double *r0,double *r1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if ((a == 0.0) && (!NAN(a))) {
    if ((b == 0.0) && (!NAN(b))) {
      *r1 = 0.0;
      *r0 = 0.0;
      return -2 - (uint)(c == 0.0);
    }
    *r1 = -c / b;
    *r0 = -c / b;
    return -1;
  }
  if ((c != 0.0) || (NAN(c))) {
    if ((b != 0.0) || (NAN(b))) {
      dVar2 = a * -4.0 * c + b * b;
      dVar3 = ABS(dVar2);
      dVar1 = b * b * 2.220446049250313e-16;
      dVar2 = (double)(-(ulong)(dVar1 < dVar3) & (ulong)dVar2);
      if (dVar2 <= 0.0) {
        dVar4 = (b * -0.5) / a;
        *r0 = dVar4;
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          dVar3 = (double)(-(ulong)(dVar1 < dVar3) & (ulong)dVar3);
          if (dVar3 < 0.0) {
            dVar3 = sqrt(dVar3);
          }
          else {
            dVar3 = SQRT(dVar3);
          }
          dVar2 = ABS((dVar3 * 0.5) / a);
          *r1 = dVar2;
          dVar4 = *r0;
          dVar3 = (a * dVar4 + b) * dVar4 + c;
          if ((((a <= 0.0) || (0.0 < dVar3)) && ((0.0 <= a || (dVar3 < 0.0)))) &&
             ((ABS(dVar3 - dVar2 * a * dVar2) < ABS(dVar3) &&
              (ABS(((a + a) * dVar4 + b) * dVar2) < ABS(dVar3))))) {
            return 2;
          }
        }
        *r1 = dVar4;
      }
      else {
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        dVar2 = (ABS(b) + dVar2) * 0.5;
        dVar3 = (double)(-(ulong)(0.0 < b) & (ulong)-dVar2 | ~-(ulong)(0.0 < b) & (ulong)dVar2);
        dVar2 = c / dVar3;
        dVar3 = dVar3 / a;
        if ((dVar3 != dVar2) || (NAN(dVar3) || NAN(dVar2))) {
          dVar1 = dVar3;
          if (dVar3 <= dVar2) {
            dVar1 = dVar2;
            dVar2 = dVar3;
          }
          dVar3 = (b * -0.5) / a;
          if ((dVar2 <= dVar3) && (dVar3 <= dVar1)) {
            dVar4 = (a * dVar3 + b) * dVar3 + c;
            if ((((ABS(dVar4) <= ABS((a * dVar2 + b) * dVar2 + c)) ||
                 (ABS(dVar4) <= ABS((a * dVar1 + b) * dVar1 + c))) || ((0.0 < a && (0.0 < dVar4))))
               || ((a < 0.0 && (dVar4 < 0.0)))) {
              *r1 = dVar3;
              *r0 = dVar3;
              return 1;
            }
          }
          *r0 = dVar2;
          *r1 = dVar1;
          return 0;
        }
        *r1 = dVar3;
        *r0 = dVar3;
      }
      return 1;
    }
    dVar2 = ABS(c / -a);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    *r1 = dVar2;
    if (c / -a < 0.0) {
      *r0 = 0.0;
      return 2;
    }
    *r0 = -dVar2;
  }
  else {
    if ((b == 0.0) && (!NAN(b))) {
      *r1 = 0.0;
      *r0 = 0.0;
      return 1;
    }
    dVar1 = b / -a;
    dVar3 = 0.0;
    dVar2 = dVar1;
    if (0.0 <= dVar1) {
      dVar2 = 0.0;
      dVar3 = dVar1;
    }
    *r0 = dVar2;
    *r1 = dVar3;
  }
  return 0;
}

Assistant:

int
ON_SolveQuadraticEquation(
       double a, double b, double c, 
       double *r0, double *r1
       )
/* Find solutions of a quadratic equation
 *
 * INPUT:
 *   a, b, c  coefficients defining the quadratic equation
 *            a*t^2 + b*t + c = 0
 *   r0, r1   address of doubles
 * OUTPUT:
 *   ON_QuadraticEquation()
 *      0: successful - two distinct real roots (*r0 < *r1)
 *      1: successful - one real root (*r0 = *r1)
 *      2: successful - two complex conjugate roots (*r0 +/- (*r1)*sqrt(-1))
 *     -1: failure - a = 0, b != 0        (*r0 = *r1 = -c/b)
 *     -2: failure - a = 0, b  = 0 c != 0 (*r0 = *r1 = 0.0)
 *     -3: failure - a = 0, b  = 0 c  = 0 (*r0 = *r1 = 0.0)
 *
 * COMMENTS:
 *   The quadratic equation is solved using the formula
 *   roots = q/a, c/q, q = 0.5*(b + sgn(b)*sqrt(b^2 - 4ac)).
 *
 *   When |b^2 - 4*a*c| <= b*b*ON_EPSILON, the discriminant
 *   is numerical noise and is assumed to be zero.
 *
 *   If it is really important to have the best possible answer,
 *   you should probably tune up the returned roots using
 *   Brent's algorithm.
 *
 * REFERENCE:
 *   Numerical Recipes in C, section 5.5
 *
 * RELATED FUNCTIONS:
 *   ON_CubicEquation()
 */
{
  double q, x0, x1, y0, y1, y;

  if (a == 0.0) {
    if (b == 0.0) 
      {*r0 = *r1 = 0.0; return (c == 0.0) ? -3 : -2;}
    *r0 = *r1 = -c/b; return -1;
  }

  if (c == 0.0) {
    if (b == 0.0) 
      {*r0 = *r1 = 0.0; return 1;}
    b /= -a;
    if (b < 0.0) 
      {*r0=b;*r1=0.0;} 
    else
      {*r0=0.0;*r1=b;}
    return 0;
  }

  if (b == 0.0) {
    c /= -a;
    *r1 = sqrt(fabs(c));
    if (c < 0.0) 
      {*r0 = 0.0; return 2;}
    *r0 = -(*r1);
    return 0;
  }
  q = b*b - 4.0*a*c;
  if (fabs(q) <= b*b* ON_EPSILON) 
    q = 0.0; /* q is noise - set it to zero */
  if (q <= 0.0) {
    /* multiple real root or complex conjugate roots */
    *r0 = -0.5*b/a;
    if (q == 0.0) 
      {*r1 = *r0; return 1;}

    /* complex conjugate roots (probably) */
    *r1 = fabs(0.5*sqrt(fabs(q))/a); 
    x0 = *r0;
    x1 = *r1;
    y = (a*x0 + b)*x0 + c;            /* y = quadratic evaluated at -b/2a */
    if ((a > 0.0 && y <= 0.0) || (a < 0.0 && y >= 0.0))
      {*r1 = *r0; return 1;}
    y0 = y - a*x1*x1;                 /* y0 = real part of "zero" */
    y1 = (2.0*a*x0 + b)*x1;           /* y1 = imaginary part of "zero" */
    if (fabs(y) <= fabs(y0) || fabs(y) <= fabs(y1)) 
      {*r1 = *r0; return 1;}
    return 2;
  }

  /* distinct roots (probably) */
  q = 0.5*(fabs(b) + sqrt(q));
  if (b > 0.0) q = -q;
  x0 = q/a;
  x1 = c/q;
  if (x0 == x1) 
    {*r0 = *r1 = x0; return 1;}

  if (x0 > x1) 
    {y = x0; x0 = x1; x1 = y;}

  /* quick test to see if roots are numerically distinct from extrema */
  y = -0.5*b/a;
  if (x0 <= y && y <= x1) {
    y = (a*y + b)*y + c;              /* y = quadratic evaluated at -b/2a */
    y0 = (a*x0 + b)*x0 + c;
    y1 = (a*x1 + b)*x1 + c;
    if (fabs(y) <= fabs(y0) || fabs(y) <= fabs(y1)
        || (a > 0.0 && y > 0.0) || (a < 0.0 && y < 0.0))
      {*r0 = *r1 = -0.5*b/a; return 1;}
  }

  /* distinct roots */
  *r0 = x0;
  *r1 = x1;
  return 0;
}